

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

int glist_dofinderror(_glist *gl,void *error_object)

{
  int iVar1;
  int iVar2;
  t_pd *pp_Var3;
  t_atom *a;
  t_symbol *ptVar4;
  _glist *gl_00;
  int local_54;
  int i;
  t_symbol *s;
  t_atom *argv;
  int argc;
  t_text *x;
  _glist *p_Stack_28;
  int n;
  t_gobj *g;
  void *error_object_local;
  _glist *gl_local;
  
  p_Stack_28 = (_glist *)gl->gl_list;
  while( true ) {
    if (p_Stack_28 == (_glist *)0x0) {
      return 0;
    }
    if ((p_Stack_28 == (_glist *)error_object) ||
       (pp_Var3 = message_get_responder((t_gobj *)p_Stack_28), pp_Var3 == (t_pd *)error_object))
    break;
    if ((p_Stack_28->gl_obj).te_g.g_pd == canvas_class) {
      iVar1 = glist_dofinderror(p_Stack_28,error_object);
      if (iVar1 != 0) {
        return 1;
      }
    }
    else {
      iVar1 = clone_get_n((t_gobj *)p_Stack_28);
      if (iVar1 != 0) {
        for (local_54 = 0; local_54 < iVar1; local_54 = local_54 + 1) {
          gl_00 = clone_get_instance((t_gobj *)p_Stack_28,local_54);
          iVar2 = glist_dofinderror(gl_00,error_object);
          if (iVar2 != 0) {
            return 1;
          }
        }
      }
    }
    p_Stack_28 = (_glist *)(p_Stack_28->gl_obj).te_g.g_next;
  }
  glist_noselect(gl);
  canvas_vis(gl,1.0);
  canvas_editmode(gl,1.0);
  glist_select(gl,(t_gobj *)p_Stack_28);
  if ((p_Stack_28->gl_obj).te_g.g_pd == text_class) {
    iVar1 = binbuf_getnatom((p_Stack_28->gl_obj).te_binbuf);
    a = binbuf_getvec((p_Stack_28->gl_obj).te_binbuf);
    if ((((0 < iVar1) && (a->a_type == A_SYMBOL)) &&
        (ptVar4 = atom_getsymbol(a), ptVar4 != (t_symbol *)0x0)) &&
       ((ptVar4->s_name != (char *)0x0 && (*ptVar4->s_name != '\0')))) {
      pdgui_vmess("::deken::open_search_objects","s",ptVar4->s_name);
    }
  }
  return 1;
}

Assistant:

static int glist_dofinderror(t_glist *gl, const void *error_object)
{
    t_gobj *g;
    int n;

    for (g = gl->gl_list; g; g = g->g_next)
    {
        if (((const void *)g == error_object) || (message_get_responder(g) == error_object))
        {
                /* got it... now show it. */
            glist_noselect(gl);
            canvas_vis((t_canvas *)gl, 1);
            canvas_editmode((t_canvas *)gl, 1.);
            glist_select(gl, g);
            if (pd_class(&g->g_pd) == text_class) {
                t_text* x = (t_text*)g;
                int argc = binbuf_getnatom(x->te_binbuf);
                t_atom*argv = binbuf_getvec(x->te_binbuf);
                if(argc>0 && A_SYMBOL == argv[0].a_type) {
                    t_symbol*s = atom_getsymbol(argv);
                    if (s && s->s_name && *s->s_name)
                        pdgui_vmess("::deken::open_search_objects", "s", s->s_name);
                }
            }
            return (1);
        }
        else if (g->g_pd == canvas_class)
        {
            if (glist_dofinderror((t_canvas *)g, error_object))
                return (1);
        }
        else if ((n = clone_get_n(g)) != 0)
        {
            int i;
            for(i = 0; i < n; i++)
            {
                if (glist_dofinderror(clone_get_instance(g, i), error_object))
                    return 1;
            }
        }
    }
    return (0);
}